

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstrformat.cpp
# Opt level: O0

int StringFormat::writepad(OutputFunc output,void *outputData,char *pad,int padsize,int spaceToFill)

{
  int iVar1;
  int local_34;
  int local_2c;
  int count;
  int outlen;
  int spaceToFill_local;
  int padsize_local;
  char *pad_local;
  void *outputData_local;
  OutputFunc output_local;
  
  local_2c = 0;
  for (count = spaceToFill; 0 < count; count = count - local_34) {
    local_34 = padsize;
    if (count <= padsize) {
      local_34 = count;
    }
    iVar1 = (*output)(outputData,pad,local_34);
    local_2c = iVar1 + local_2c;
  }
  return local_2c;
}

Assistant:

static int writepad (OutputFunc output, void *outputData, const char *pad, int padsize, int spaceToFill)
	{
		int outlen = 0;
		while (spaceToFill > 0)
		{
			int count = spaceToFill > padsize ? padsize : spaceToFill;
			outlen += output (outputData, pad, count);
			spaceToFill -= count;
		}
		return outlen;
	}